

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressbar.cpp
# Opt level: O0

void __thiscall QtMWidgets::ProgressBar::ProgressBar(ProgressBar *this,QWidget *parent)

{
  ProgressBarPrivate *pPVar1;
  ProgressBarPrivate *this_00;
  Object local_38 [28];
  QFlags<Qt::WindowType> local_1c;
  QWidget *local_18;
  QWidget *parent_local;
  ProgressBar *this_local;
  
  local_18 = parent;
  parent_local = &this->super_QWidget;
  QFlags<Qt::WindowType>::QFlags(&local_1c);
  QWidget::QWidget(&this->super_QWidget,parent,(QFlags_conflict1 *)(ulong)local_1c.i);
  *(undefined ***)this = &PTR_metaObject_00236878;
  *(undefined ***)&this->field_0x10 = &PTR__ProgressBar_00236a28;
  pPVar1 = (ProgressBarPrivate *)operator_new(0x68);
  ProgressBarPrivate::ProgressBarPrivate(pPVar1,this);
  QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
  ::QScopedPointer(&this->d,pPVar1);
  this_00 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
            ::operator->(&this->d);
  ProgressBarPrivate::init(this_00,(EVP_PKEY_CTX *)pPVar1);
  pPVar1 = QScopedPointer<QtMWidgets::ProgressBarPrivate,_QScopedPointerDeleter<QtMWidgets::ProgressBarPrivate>_>
           ::operator->(&this->d);
  QObject::
  connect<void(QVariantAnimation::*)(QVariant_const&),void(QtMWidgets::ProgressBar::*)(QVariant_const&)>
            (local_38,(offset_in_QVariantAnimation_to_subr)pPVar1->animation,
             (Object *)QVariantAnimation::valueChanged,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  return;
}

Assistant:

ProgressBar::ProgressBar( QWidget * parent )
	:	QWidget( parent )
	,	d( new ProgressBarPrivate( this ) )
{
	d->init();

	connect( d->animation, &QVariantAnimation::valueChanged,
		this, &ProgressBar::_q_animation );
}